

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::base_text::load(base_text *this,context *context)

{
  byte bVar1;
  bool bVar2;
  request *this_00;
  pointer ppVar3;
  long lVar4;
  long *in_RDI;
  const_iterator p;
  base_widget *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  context *in_stack_ffffffffffffff28;
  size_t *count;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  request *in_stack_ffffffffffffff58;
  locale *loc;
  locale local_80 [8];
  _Self local_78 [3];
  locale local_60 [32];
  _Base_ptr local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string local_30 [48];
  
  base_widget::pre_load
            ((base_widget *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (context *)in_stack_ffffffffffffff18);
  std::__cxx11::string::clear();
  in_RDI[7] = 0;
  base_widget::set((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),true);
  base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),true);
  base_widget::name_abi_cxx11_(in_stack_ffffffffffffff18);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_30);
  if ((bVar1 & 1) == 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_38);
    http::context::request((context *)0x3f74ca);
    this_00 = (request *)http::request::post_or_get_abi_cxx11_(in_stack_ffffffffffffff58);
    loc = local_60;
    base_widget::name_abi_cxx11_(in_stack_ffffffffffffff18);
    local_40 = (_Base_ptr)
               std::
               multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffff18,(key_type *)0x3f7507);
    local_38._M_node = local_40;
    std::__cxx11::string::~string((string *)local_60);
    http::context::request((context *)0x3f7545);
    http::request::post_or_get_abi_cxx11_(this_00);
    local_78[0]._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff18);
    bVar2 = std::operator==(&local_38,local_78);
    if (!bVar2) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x3f75a7);
      std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)&ppVar3->second);
      if ((*(byte *)(in_RDI + 6) & 1) == 0) {
        lVar4 = std::__cxx11::string::size();
        in_RDI[7] = lVar4;
      }
      else {
        count = (size_t *)(in_RDI + 7);
        in_RDI[7] = 0;
        http::context::locale(in_stack_ffffffffffffff28);
        std::__cxx11::string::data();
        std::__cxx11::string::data();
        std::__cxx11::string::size();
        bVar2 = encoding::valid(loc,(char *)this_00,
                                (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50
                                                ),count);
        bVar1 = bVar2 ^ 0xff;
        std::locale::~locale(local_80);
        if ((bVar1 & 1) != 0) {
          base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
        }
      }
    }
  }
  return;
}

Assistant:

void base_text::load(http::context &context)
{
	pre_load(context);
	value_.clear();
	code_points_ = 0;
	set(true); // we don't care if the value was set
	valid(true);
	if(name().empty()) {
		return;
	}
	http::request::form_type::const_iterator p;
	p=context.request().post_or_get().find(name());
	if(p==context.request().post_or_get().end()) {
		return;	
	}
	value_=p->second;
	if(validate_charset_) {
		code_points_ = 0;
		if(!encoding::valid(context.locale(),value_.data(),value_.data()+value_.size(),code_points_))
			valid(false);
	}
	else {
		code_points_=value_.size();
	}
}